

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proctitle.c
# Opt level: O3

char ** uv_setup_args(int argc,char **argv)

{
  char *__s;
  char *__s_00;
  size_t sVar1;
  size_t sVar2;
  char **ppcVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  char **__dest;
  size_t sVar7;
  long lVar8;
  
  if (0 < argc) {
    uVar4 = (ulong)(uint)argc;
    __s = *argv;
    sVar1 = strlen(__s);
    sVar5 = sVar1 + 1;
    sVar7 = sVar5;
    if (argc != 1) {
      uVar6 = 1;
      do {
        sVar2 = strlen(argv[uVar6]);
        sVar7 = sVar7 + sVar2 + 1;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    ppcVar3 = (char **)uv__malloc(sVar7 + uVar4 * 8 + 8);
    if (ppcVar3 != (char **)0x0) {
      __dest = ppcVar3 + uVar4 + 1;
      memcpy(__dest,*argv,sVar5);
      *ppcVar3 = (char *)__dest;
      if (argc == 1) {
        lVar8 = 0;
        uVar4 = 1;
      }
      else {
        uVar4 = 2;
        if (2 < argc) {
          uVar4 = (ulong)(uint)argc;
        }
        lVar8 = 0;
        do {
          __dest = (char **)((long)__dest + sVar5);
          __s_00 = argv[lVar8 + 1];
          sVar5 = strlen(__s_00);
          sVar5 = sVar5 + 1;
          memcpy(__dest,__s_00,sVar5);
          ppcVar3[lVar8 + 1] = (char *)__dest;
          lVar8 = lVar8 + 1;
        } while (uVar4 - 1 != lVar8);
      }
      ppcVar3[uVar4] = (char *)0x0;
      process_title_2 = argv[lVar8] + (sVar5 - (long)*argv);
      argv = ppcVar3;
      args_mem = ppcVar3;
      process_title_0 = __s;
      process_title_1 = sVar1;
    }
  }
  return argv;
}

Assistant:

char** uv_setup_args(int argc, char** argv) {
  struct uv__process_title pt;
  char** new_argv;
  size_t size;
  char* s;
  int i;

  if (argc <= 0)
    return argv;

  pt.str = argv[0];
  pt.len = strlen(argv[0]);
  pt.cap = pt.len + 1;

  /* Calculate how much memory we need for the argv strings. */
  size = pt.cap;
  for (i = 1; i < argc; i++)
    size += strlen(argv[i]) + 1;

  /* Add space for the argv pointers. */
  size += (argc + 1) * sizeof(char*);

  new_argv = uv__malloc(size);
  if (new_argv == NULL)
    return argv;

  /* Copy over the strings and set up the pointer table. */
  i = 0;
  s = (char*) &new_argv[argc + 1];
  size = pt.cap;
  goto loop;

  for (/* empty */; i < argc; i++) {
    size = strlen(argv[i]) + 1;
  loop:
    memcpy(s, argv[i], size);
    new_argv[i] = s;
    s += size;
  }
  new_argv[i] = NULL;

  /* argv is not adjacent on z/os, we use just argv[0] on that platform. */
#ifndef __MVS__
  pt.cap = argv[i - 1] + size - argv[0];
#endif

  args_mem = new_argv;
  process_title = pt;

  return new_argv;
}